

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

int GetCurrentMonitor(void)

{
  int iVar1;
  bool bVar2;
  GLFWmonitor **ppGVar3;
  GLFWmonitor *pGVar4;
  GLFWvidmode *pGVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int monitorCount;
  int my;
  int mx;
  int wcy;
  int wcx;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_44 = 0;
  ppGVar3 = glfwGetMonitors(&local_44);
  uVar8 = 0;
  if (0 < local_44) {
    if (CORE.Window.fullscreen == true) {
      pGVar4 = glfwGetWindowMonitor(platform.handle);
      if (0 < (long)local_44) {
        uVar8 = 0;
        do {
          if (ppGVar3[uVar8] == pGVar4) goto LAB_001274b1;
          uVar8 = uVar8 + 1;
        } while ((long)local_44 != uVar8);
        uVar8 = 0;
      }
    }
    else {
      uVar8 = 0;
      local_34 = 0;
      local_38 = 0;
      glfwGetWindowPos(platform.handle,&local_34,&local_38);
      local_34 = local_34 + (int)CORE.Window.screen.width / 2;
      local_38 = local_38 + (int)CORE.Window.screen.height / 2;
      if (0 < local_44) {
        iVar9 = 0x7fffffff;
        uVar10 = 0;
        uVar8 = 0;
        do {
          local_3c = 0;
          local_40 = 0;
          pGVar4 = ppGVar3[uVar10];
          glfwGetMonitorPos(pGVar4,&local_3c,&local_40);
          pGVar5 = glfwGetVideoMode(pGVar4);
          if (pGVar5 == (GLFWvidmode *)0x0) {
            TraceLog(4,"GLFW: Failed to find video mode for selected monitor");
LAB_0012749a:
            bVar2 = true;
          }
          else {
            iVar6 = pGVar5->width + local_3c;
            iVar1 = pGVar5->height + local_40;
            if ((((local_34 < local_3c) || (iVar6 <= local_34)) || (local_38 < local_40)) ||
               (iVar1 <= local_38)) {
              iVar7 = local_34;
              if (iVar6 <= local_34) {
                iVar7 = pGVar5->width + local_3c + -1;
              }
              if (local_34 < local_3c) {
                iVar7 = local_3c;
              }
              iVar6 = local_38;
              if (iVar1 <= local_38) {
                iVar6 = pGVar5->height + local_40 + -1;
              }
              if (local_38 < local_40) {
                iVar6 = local_40;
              }
              iVar6 = (local_38 - iVar6) * (local_38 - iVar6) +
                      (local_34 - iVar7) * (local_34 - iVar7);
              if (iVar6 < iVar9) {
                uVar8 = uVar10 & 0xffffffff;
                iVar9 = iVar6;
              }
              goto LAB_0012749a;
            }
            bVar2 = false;
            uVar8 = uVar10 & 0xffffffff;
          }
        } while ((bVar2) && (uVar10 = uVar10 + 1, (long)uVar10 < (long)local_44));
      }
    }
  }
LAB_001274b1:
  return (int)uVar8;
}

Assistant:

int GetCurrentMonitor(void)
{
    int index = 0;
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);
    GLFWmonitor *monitor = NULL;

    if (monitorCount >= 1)
    {
        if (IsWindowFullscreen())
        {
            // Get the handle of the monitor that the specified window is in full screen on
            monitor = glfwGetWindowMonitor(platform.handle);

            for (int i = 0; i < monitorCount; i++)
            {
                if (monitors[i] == monitor)
                {
                    index = i;
                    break;
                }
            }
        }
        else
        {
            // In case the window is between two monitors, we use below logic
            // to try to detect the "current monitor" for that window, note that
            // this is probably an overengineered solution for a very side case
            // trying to match SDL behaviour

            int closestDist = 0x7FFFFFFF;

            // Window center position
            int wcx = 0;
            int wcy = 0;

            glfwGetWindowPos(platform.handle, &wcx, &wcy);
            wcx += (int)CORE.Window.screen.width/2;
            wcy += (int)CORE.Window.screen.height/2;

            for (int i = 0; i < monitorCount; i++)
            {
                // Monitor top-left position
                int mx = 0;
                int my = 0;

                monitor = monitors[i];
                glfwGetMonitorPos(monitor, &mx, &my);
                const GLFWvidmode *mode = glfwGetVideoMode(monitor);

                if (mode)
                {
                    const int right = mx + mode->width - 1;
                    const int bottom = my + mode->height - 1;

                    if ((wcx >= mx) &&
                        (wcx <= right) &&
                        (wcy >= my) &&
                        (wcy <= bottom))
                    {
                        index = i;
                        break;
                    }

                    int xclosest = wcx;
                    if (wcx < mx) xclosest = mx;
                    else if (wcx > right) xclosest = right;

                    int yclosest = wcy;
                    if (wcy < my) yclosest = my;
                    else if (wcy > bottom) yclosest = bottom;

                    int dx = wcx - xclosest;
                    int dy = wcy - yclosest;
                    int dist = (dx*dx) + (dy*dy);
                    if (dist < closestDist)
                    {
                        index = i;
                        closestDist = dist;
                    }
                }
                else TRACELOG(LOG_WARNING, "GLFW: Failed to find video mode for selected monitor");
            }
        }
    }

    return index;
}